

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  ssize_t sVar1;
  int iVar2;
  size_t __n;
  void *pvVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  byte *pbVar7;
  undefined1 *puVar8;
  uint local_98;
  uint local_94;
  int n_1;
  int n;
  ssize_t body;
  ssize_t l;
  ssize_t namelen;
  ssize_t nl;
  ssize_t llen;
  ssize_t len;
  ssize_t total;
  ssize_t used;
  ssize_t ravail;
  ssize_t avail_in;
  uchar *out;
  uchar *d;
  uchar *b;
  uudecode *uudecode;
  void **buff_local;
  archive_read_filter *self_local;
  
  b = (uchar *)self->data;
  uudecode = (uudecode *)buff;
  buff_local = (void **)self;
LAB_0013c96f:
  out = (uchar *)__archive_read_filter_ahead((archive_read_filter *)buff_local[2],1,&ravail);
  if ((out == (uchar *)0x0) && (ravail < 0)) {
    return -0x1e;
  }
  if (out == (uchar *)0x0) {
    ravail = 0;
  }
  total = 0;
  len = 0;
  avail_in = *(ssize_t *)(b + 0x20);
  used = ravail;
  if (*(int *)(b + 0x28) != 4) {
    if (*(long *)(b + 0x10) != 0) {
      if (0x8800 < *(long *)(b + 0x10)) {
        archive_set_error((archive *)buff_local[3],0x54,"Invalid format data");
        return -0x1e;
      }
      iVar2 = ensure_in_buff_size((archive_read_filter *)buff_local,(uudecode *)b,
                                  ravail + *(long *)(b + 0x10));
      if (iVar2 != 0) {
        return -0x1e;
      }
      memcpy((void *)(*(long *)(b + 8) + *(long *)(b + 0x10)),out,ravail);
      out = *(uchar **)(b + 8);
      ravail = *(long *)(b + 0x10) + ravail;
      b[0x10] = '\0';
      b[0x11] = '\0';
      b[0x12] = '\0';
      b[0x13] = '\0';
      b[0x14] = '\0';
      b[0x15] = '\0';
      b[0x16] = '\0';
      b[0x17] = '\0';
    }
LAB_0013caa5:
    if (ravail <= total) goto LAB_0013d4af;
    d = out;
    llen = get_line(out,ravail - total,&namelen);
    if (llen < 0) {
      if ((*(int *)(b + 0x28) != 0) || ((*(long *)b < 1 && (len < 1)))) {
        archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
        return -0x1e;
      }
      b[0x28] = '\x04';
      b[0x29] = '\0';
      b[0x2a] = '\0';
      b[0x2b] = '\0';
      total = ravail;
      goto LAB_0013d4af;
    }
    nl = llen;
    if ((namelen == 0) && (*(int *)(b + 0x28) != 2)) goto code_r0x0013cb57;
    switch(*(undefined4 *)(b + 0x28)) {
    default:
      if (0x1ffff < len + llen) {
        archive_set_error((archive *)buff_local[3],0x54,"Invalid format data");
        return -0x1e;
      }
      if ((llen - namelen < 0xb) || (iVar2 = memcmp(d,"begin ",6), iVar2 != 0)) {
        if ((llen - namelen < 0x12) || (iVar2 = memcmp(d,"begin-base64 ",0xd), iVar2 != 0)) {
          body = 0;
        }
        else {
          body = 0xd;
        }
      }
      else {
        body = 6;
      }
      if (((body != 0) && (0x2f < d[body])) &&
         ((d[body] < 0x38 &&
          ((((0x2f < d[body + 1] && (d[body + 1] < 0x38)) && (0x2f < d[body + 2])) &&
           ((d[body + 2] < 0x38 && (d[body + 3] == ' ')))))))) {
        if (body == 6) {
          b[0x28] = '\x01';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
        }
        else {
          b[0x28] = '\x03';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
        }
        *(uint *)(b + 0x2c) =
             (d[body] - 0x30) * 0x40 + (d[body + 1] - 0x30) * 8 + (d[body + 2] - 0x30);
        b[0x30] = '\x01';
        b[0x31] = '\0';
        b[0x32] = '\0';
        b[0x33] = '\0';
        __n = ((llen - namelen) + -4) - body;
        if (1 < (long)__n) {
          if (*(long *)(b + 0x38) != 0) {
            free(*(void **)(b + 0x38));
          }
          pvVar3 = malloc(__n + 1);
          *(void **)(b + 0x38) = pvVar3;
          if (*(long *)(b + 0x38) == 0) {
            archive_set_error((archive *)buff_local[3],0xc,"Can\'t allocate data for uudecode");
            return -0x1e;
          }
          strncpy(*(char **)(b + 0x38),(char *)(d + body + 4),__n);
          *(undefined1 *)(*(long *)(b + 0x38) + __n) = 0;
        }
      }
      break;
    case 1:
      if (0x10000 < len + llen * 2) goto LAB_0013d4af;
      if ((""[*d] == '\0') || (llen - namelen < 1)) {
        archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
        return -0x1e;
      }
      puVar6 = d + 1;
      body = (ssize_t)(int)(*d - 0x20 & 0x3f);
      d = puVar6;
      if ((llen - namelen) + -1 < body) {
        archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
        return -0x1e;
      }
      if (body != 0) {
        do {
          lVar5 = body;
          sVar1 = len;
          puVar8 = (undefined1 *)avail_in;
          pbVar7 = d;
          if (((body < 1) || (""[*d] == '\0')) || (""[d[1]] == '\0')) goto LAB_0013d156;
          pbVar7 = d + 2;
          local_94 = (d[1] - 0x20 & 0x3f) << 0xc | (*d - 0x20 & 0x3f) << 0x12;
          puVar8 = (undefined1 *)(avail_in + 1);
          *(char *)avail_in = (char)(local_94 >> 0x10);
          lVar5 = body + -1;
          lVar4 = len + 1;
          if (0 < lVar5) {
            sVar1 = len + 1;
            if (""[*pbVar7] == '\0') goto LAB_0013d156;
            local_94 = (*pbVar7 - 0x20 & 0x3f) << 6 | local_94;
            *puVar8 = (char)(local_94 >> 8);
            lVar5 = body + -2;
            lVar4 = len + 2;
            puVar8 = (undefined1 *)(avail_in + 2);
            pbVar7 = d + 3;
          }
          d = pbVar7;
          avail_in = (ssize_t)puVar8;
          len = lVar4;
          body = lVar5;
          if (0 < body) {
            lVar5 = body;
            sVar1 = len;
            puVar8 = (undefined1 *)avail_in;
            pbVar7 = d;
            if (""[*d] == '\0') goto LAB_0013d156;
            *(byte *)avail_in = *d - 0x20 & 0x3f | (byte)local_94;
            len = len + 1;
            body = body + -1;
            avail_in = avail_in + 1;
            d = d + 1;
          }
        } while( true );
      }
      b[0x28] = '\x02';
      b[0x29] = '\0';
      b[0x2a] = '\0';
      b[0x2b] = '\0';
      break;
    case 2:
      if ((llen - namelen != 3) || (iVar2 = memcmp(d,"end ",3), iVar2 != 0)) {
        archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
        return -0x1e;
      }
      b[0x28] = '\0';
      b[0x29] = '\0';
      b[0x2a] = '\0';
      b[0x2b] = '\0';
      break;
    case 3:
      if (0x10000 < len + llen * 2) goto LAB_0013d4af;
      body = llen - namelen;
      if ((((body < 3) || (*d != '=')) || (d[1] != '=')) || (d[2] != '=')) {
        do {
          lVar5 = body;
          lVar4 = len;
          puVar8 = (undefined1 *)avail_in;
          pbVar7 = d;
          if (((body < 1) || (""[*d] == '\0')) || (""[d[1]] == '\0')) goto LAB_0013d454;
          pbVar7 = d + 2;
          local_98 = base64num[d[1]] << 0xc | base64num[*d] << 0x12;
          puVar8 = (undefined1 *)(avail_in + 1);
          *(char *)avail_in = (char)(local_98 >> 0x10);
          lVar4 = len + 1;
          lVar5 = body + -2;
          if (0 < lVar5) {
            if ((*pbVar7 == 0x3d) || (""[*pbVar7] == '\0')) goto LAB_0013d454;
            local_98 = base64num[*pbVar7] << 6 | local_98;
            *puVar8 = (char)(local_98 >> 8);
            lVar5 = body + -3;
            lVar4 = len + 2;
            puVar8 = (undefined1 *)(avail_in + 2);
            pbVar7 = d + 3;
          }
          d = pbVar7;
          avail_in = (ssize_t)puVar8;
          len = lVar4;
          body = lVar5;
          if (0 < body) {
            lVar5 = body;
            lVar4 = len;
            puVar8 = (undefined1 *)avail_in;
            pbVar7 = d;
            if ((*d == '=') || (""[*d] == '\0')) goto LAB_0013d454;
            *(byte *)avail_in = (byte)base64num[*d] | (byte)local_98;
            len = len + 1;
            body = body + -1;
            avail_in = avail_in + 1;
            d = d + 1;
          }
        } while( true );
      }
      b[0x28] = '\0';
      b[0x29] = '\0';
      b[0x2a] = '\0';
      b[0x2b] = '\0';
    }
    goto LAB_0013d48e;
  }
  total = ravail;
  goto LAB_0013d4af;
code_r0x0013cb57:
  if ((len == 0) && (used < 1)) {
    archive_set_error((archive *)buff_local[3],0x54,"Missing format data");
    return -0x1e;
  }
  iVar2 = ensure_in_buff_size((archive_read_filter *)buff_local,(uudecode *)b,llen);
  if (iVar2 != 0) {
    return -0x1e;
  }
  if (*(uchar **)(b + 8) != d) {
    memmove(*(void **)(b + 8),d,llen);
  }
  *(ssize_t *)(b + 0x10) = llen;
  if (len != 0) {
    total = llen + total;
LAB_0013d4af:
    if (used < ravail) {
      total = total - (ravail - used);
    }
    __archive_read_filter_consume((archive_read_filter *)buff_local[2],total);
    uudecode->total = *(int64_t *)(b + 0x20);
    *(ssize_t *)b = len + *(long *)b;
    return len;
  }
  __archive_read_filter_consume((archive_read_filter *)buff_local[2],used);
  goto LAB_0013c96f;
LAB_0013d454:
  d = pbVar7;
  avail_in = (ssize_t)puVar8;
  len = lVar4;
  body = lVar5;
  if ((body != 0) && (*d != '=')) {
    archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
    return -0x1e;
  }
LAB_0013d48e:
  out = out + nl;
  total = nl + total;
  goto LAB_0013caa5;
LAB_0013d156:
  d = pbVar7;
  avail_in = (ssize_t)puVar8;
  len = sVar1;
  body = lVar5;
  if (body != 0) {
    archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
    return -0x1e;
  }
  goto LAB_0013d48e;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl, namelen;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		if (uudecode->in_cnt > UUENCODE_MAX_LINE_LENGTH) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid format data");
			return (ARCHIVE_FATAL);
		}
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		ssize_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
				uudecode->mode = (mode_t)(
				    ((int)(b[l] - '0') * 64) +
				    ((int)(b[l+1] - '0') * 8) +
				     (int)(b[l+2] - '0'));
				uudecode->mode_set = 1;
				namelen = len - nl - 4 - l;
				if (namelen > 1) {
					if (uudecode->name != NULL)
						free(uudecode->name);
					uudecode->name = malloc(namelen + 1);
			                if (uudecode->name == NULL) {
					archive_set_error(
					    &self->archive->archive,
					    ENOMEM,
					    "Can't allocate data for uudecode");
						return (ARCHIVE_FATAL);
					}
					strncpy(uudecode->name,
					    (const char *)(b + l + 4),
					    namelen);
					uudecode->name[namelen] = '\0';
				}
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}